

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::merge_wire_assignments(Generator *top)

{
  undefined1 local_58 [8];
  MergeWireAssignmentsVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  MergeWireAssignmentsVisitor::MergeWireAssignmentsVisitor((MergeWireAssignmentsVisitor *)local_58);
  IRVisitor::visit_root_s
            ((IRVisitor *)local_58,(IRNode *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket)
  ;
  MergeWireAssignmentsVisitor::~MergeWireAssignmentsVisitor((MergeWireAssignmentsVisitor *)local_58)
  ;
  return;
}

Assistant:

void merge_wire_assignments(Generator* top) {
    // for now we only merge generator-level assignments
    MergeWireAssignmentsVisitor visitor;
    visitor.visit_root_s(top);
}